

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O2

void cStackCompress(GlobalLU_t *Glu)

{
  int_t *new;
  int iVar1;
  int_t *piVar2;
  int_t *piVar3;
  int_t *piVar4;
  int_t *old;
  int iVar5;
  void *new_00;
  
  iVar5 = Glu->n;
  piVar2 = Glu->lsub;
  piVar3 = Glu->xlsub;
  piVar4 = Glu->xusub;
  old = Glu->usub;
  new_00 = (void *)((long)Glu->xlusup[iVar5] * 8 + (long)Glu->lusup);
  copy_mem_singlecomplex(piVar4[iVar5],Glu->ucol,new_00);
  new = (int_t *)((long)new_00 + (long)piVar4[iVar5] * 4);
  copy_mem_int(piVar3[iVar5],piVar2,new);
  piVar3 = new + piVar3[iVar5];
  copy_mem_int(piVar4[iVar5],old,piVar3);
  iVar1 = (Glu->stack).top1;
  iVar5 = (*(int *)&(Glu->stack).array + iVar1) - ((int)piVar3 + piVar4[iVar5] * 4);
  piVar2 = &(Glu->stack).used;
  *piVar2 = *piVar2 - iVar5;
  (Glu->stack).top1 = iVar1 - iVar5;
  Glu->ucol = new_00;
  Glu->lsub = new;
  Glu->usub = piVar3;
  return;
}

Assistant:

void
cStackCompress(GlobalLU_t *Glu)
{
    register int iword, dword, ndim;
    char     *last, *fragment;
    int_t    *ifrom, *ito;
    singlecomplex   *dfrom, *dto;
    int_t    *xlsub, *lsub, *xusub, *usub, *xlusup;
    singlecomplex   *ucol, *lusup;
    
    iword = sizeof(int);
    dword = sizeof(singlecomplex);
    ndim = Glu->n;

    xlsub  = Glu->xlsub;
    lsub   = Glu->lsub;
    xusub  = Glu->xusub;
    usub   = Glu->usub;
    xlusup = Glu->xlusup;
    ucol   = Glu->ucol;
    lusup  = Glu->lusup;
    
    dfrom = ucol;
    dto = (singlecomplex *)((char*)lusup + xlusup[ndim] * dword);
    copy_mem_singlecomplex(xusub[ndim], dfrom, dto);
    ucol = dto;

    ifrom = lsub;
    ito = (int_t *) ((char*)ucol + xusub[ndim] * iword);
    copy_mem_int(xlsub[ndim], ifrom, ito);
    lsub = ito;
    
    ifrom = usub;
    ito = (int_t *) ((char*)lsub + xlsub[ndim] * iword);
    copy_mem_int(xusub[ndim], ifrom, ito);
    usub = ito;
    
    last = (char*)usub + xusub[ndim] * iword;
    fragment = (char*) (((char*)Glu->stack.array + Glu->stack.top1) - last);
    Glu->stack.used -= (long int) fragment;
    Glu->stack.top1 -= (long int) fragment;

    Glu->ucol = ucol;
    Glu->lsub = lsub;
    Glu->usub = usub;
    
#if ( DEBUGlevel>=1 )
    printf("cStackCompress: fragment %lld\n", (long long) fragment);
    /* for (last = 0; last < ndim; ++last)
	print_lu_col("After compress:", last, 0);*/
#endif    
    
}